

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O3

string * __thiscall
HttpTestListener::GetRequestHeader
          (string *__return_storage_ptr__,HttpTestListener *this,string *field)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->map_request_header_)._M_t,field);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->map_request_header_)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar1._M_node + 2),
               (long)&(iVar1._M_node[2]._M_parent)->_M_color + *(long *)(iVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpTestListener::GetRequestHeader(std::string field) {
  std::map<std::string, std::string>::iterator it = this->map_request_header_.find(field);
  if(it == this->map_request_header_.end()) {
    return "";
  } else {
    return it->second;
  }
}